

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::getPointerField
          (Pipeline *__return_storage_ptr__,Pipeline *this,uint16_t pointerIndex)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  PipelineOp *pPVar4;
  PipelineOp *pPVar5;
  PipelineHook *pPVar6;
  Array<capnp::PipelineOp> *ops;
  Own<capnp::PipelineHook,_std::nullptr_t> local_90;
  PipelineOp *local_80;
  PipelineOp *newOp;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> local_50;
  Range<unsigned_long> *local_40;
  Range<unsigned_long> *__range1;
  Array<capnp::PipelineOp> newOps;
  uint16_t pointerIndex_local;
  Pipeline *this_local;
  
  newOps.disposer._6_2_ = pointerIndex;
  sVar2 = kj::Array<capnp::PipelineOp>::size(&this->ops);
  kj::heapArray<capnp::PipelineOp>((Array<capnp::PipelineOp> *)&__range1,sVar2 + 1);
  local_50 = kj::indices<kj::Array<capnp::PipelineOp>&>(&this->ops);
  local_40 = &local_50;
  __end1 = kj::Range<unsigned_long>::begin(local_40);
  i = (unsigned_long)kj::Range<unsigned_long>::end(local_40);
  while( true ) {
    bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
    newOp = (PipelineOp *)*puVar3;
    pPVar4 = kj::Array<capnp::PipelineOp>::operator[](&this->ops,(size_t)newOp);
    pPVar5 = kj::Array<capnp::PipelineOp>::operator[]
                       ((Array<capnp::PipelineOp> *)&__range1,(size_t)newOp);
    *pPVar5 = *pPVar4;
    kj::Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  sVar2 = kj::Array<capnp::PipelineOp>::size(&this->ops);
  local_80 = kj::Array<capnp::PipelineOp>::operator[]((Array<capnp::PipelineOp> *)&__range1,sVar2);
  local_80->type = GET_POINTER_FIELD;
  local_80->field_1 = newOps.disposer._6_2_;
  pPVar6 = kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator->(&this->hook);
  (**pPVar6->_vptr_PipelineHook)(&local_90);
  ops = kj::mv<kj::Array<capnp::PipelineOp>>((Array<capnp::PipelineOp> *)&__range1);
  Pipeline(__return_storage_ptr__,&local_90,ops);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_90);
  kj::Array<capnp::PipelineOp>::~Array((Array<capnp::PipelineOp> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::getPointerField(uint16_t pointerIndex) {
  auto newOps = kj::heapArray<PipelineOp>(ops.size() + 1);
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  auto& newOp = newOps[ops.size()];
  newOp.type = PipelineOp::GET_POINTER_FIELD;
  newOp.pointerIndex = pointerIndex;

  return Pipeline(hook->addRef(), kj::mv(newOps));
}